

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O1

void insertion_sort_suite::run(void)

{
  sort_1234();
  sort_1234_predicate();
  sort_4321();
  sort_4321_predicate();
  sort_3142();
  sort_4231();
  return;
}

Assistant:

void run()
{
    sort_1234();
    sort_1234_predicate();
    sort_4321();
    sort_4321_predicate();
    sort_3142();
    sort_4231();
}